

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::expandAll(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QList<QTreeViewItem>::clear(&this_00->viewItems);
  QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
  QTreeViewPrivate::layout(this_00,-1,true,false);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x268))(this);
  QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  QTreeViewPrivate::updateAccessibility(this_00);
  return;
}

Assistant:

void QTreeView::expandAll()
{
    Q_D(QTreeView);
    d->viewItems.clear();
    d->interruptDelayedItemsLayout();
    d->layout(-1, true);
    updateGeometries();
    d->viewport->update();
    d->updateAccessibility();
}